

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__psd_is16(stbi__context *s)

{
  stbi__uint32 sVar1;
  int iVar2;
  int depth;
  int channelCount;
  stbi__context *s_local;
  
  sVar1 = stbi__get32be(s);
  if (sVar1 == 0x38425053) {
    iVar2 = stbi__get16be(s);
    if (iVar2 == 1) {
      stbi__skip(s,6);
      iVar2 = stbi__get16be(s);
      if ((iVar2 < 0) || (0x10 < iVar2)) {
        stbi__rewind(s);
        s_local._4_4_ = 0;
      }
      else {
        stbi__get32be(s);
        stbi__get32be(s);
        iVar2 = stbi__get16be(s);
        if (iVar2 == 0x10) {
          s_local._4_4_ = 1;
        }
        else {
          stbi__rewind(s);
          s_local._4_4_ = 0;
        }
      }
    }
    else {
      stbi__rewind(s);
      s_local._4_4_ = 0;
    }
  }
  else {
    stbi__rewind(s);
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__psd_is16(stbi__context *s)
{
   int channelCount, depth;
   if (stbi__get32be(s) != 0x38425053) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 1) {
       stbi__rewind( s );
       return 0;
   }
   stbi__skip(s, 6);
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16) {
       stbi__rewind( s );
       return 0;
   }
   (void) stbi__get32be(s);
   (void) stbi__get32be(s);
   depth = stbi__get16be(s);
   if (depth != 16) {
       stbi__rewind( s );
       return 0;
   }
   return 1;
}